

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

uint __thiscall crnlib::command_line_params::get_count(command_line_params *this,char *pKey)

{
  param_map_const_iterator pVar1;
  _Self __tmp;
  param_map_const_iterator pVar2;
  uint uVar3;
  param_map_const_iterator end;
  param_map_const_iterator local_28;
  param_map_const_iterator local_20;
  
  local_20._M_node = (_Rb_tree_node_base *)0x0;
  local_28._M_node = (_Rb_tree_node_base *)0x0;
  find(this,pKey,&local_20,&local_28);
  pVar1._M_node = local_28._M_node;
  uVar3 = 0;
  for (pVar2._M_node = local_20._M_node; pVar2._M_node != pVar1._M_node;
      pVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar2._M_node)) {
    uVar3 = uVar3 + 1;
  }
  return uVar3;
}

Assistant:

uint command_line_params::get_count(const char* pKey) const
    {
        param_map_const_iterator begin, end;
        find(pKey, begin, end);

        uint n = 0;

        while (begin != end)
        {
            n++;
            begin++;
        }

        return n;
    }